

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O0

int anon_unknown.dwarf_67f0f0::aead_aes_gcm_siv_asm_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx_00;
  undefined1 local_198 [8];
  aead_aes_gcm_siv_asm_ctx enc_key_expanded;
  uint8_t tag [16];
  uint64_t record_enc_key [4];
  uint64_t record_auth_key [2];
  uint64_t ad_len_64;
  uint64_t in_len_64;
  aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx;
  uint8_t *nonce_local;
  size_t max_out_tag_len_local;
  size_t *out_tag_len_local;
  uint8_t *out_tag_local;
  uint8_t *out_local;
  EVP_AEAD_CTX *ctx_local;
  
  gcm_siv_ctx_00 = asm_ctx_from_ctx(ctx);
  if ((in_len < 0x1000000001) && (ad_len < 0x2000000000000000)) {
    if (max_out_tag_len < 0x10) {
      ERR_put_error(0x1e,0,0x67,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                    ,0x15b);
      ctx_local._4_4_ = 0;
    }
    else if (nonce_len == 0xc) {
      aead_aes_gcm_siv_kdf
                (gcm_siv_ctx_00->is_128_bit,gcm_siv_ctx_00,record_enc_key + 3,(uint64_t *)(tag + 8),
                 nonce);
      memset(&enc_key_expanded.field_0xf8,0,0x10);
      gcm_siv_asm_polyval(&enc_key_expanded.field_0xf8,in,in_len,ad,ad_len,
                          (uint8_t *)(record_enc_key + 3),nonce);
      if (gcm_siv_ctx_00->is_128_bit == 0) {
        aes256gcmsiv_aes_ks_enc_x1
                  (&enc_key_expanded.field_0xf8,&enc_key_expanded.field_0xf8,local_198,tag + 8);
        if (in_len < 0x80) {
          aes256gcmsiv_enc_msg_x4
                    (in,out,&enc_key_expanded.field_0xf8,local_198,in_len & 0xfffffffffffffff0);
        }
        else {
          aes256gcmsiv_enc_msg_x8
                    (in,out,&enc_key_expanded.field_0xf8,local_198,in_len & 0xfffffffffffffff0);
        }
      }
      else {
        aes128gcmsiv_aes_ks_enc_x1
                  (&enc_key_expanded.field_0xf8,&enc_key_expanded.field_0xf8,local_198,tag + 8);
        if (in_len < 0x80) {
          aes128gcmsiv_enc_msg_x4
                    (in,out,&enc_key_expanded.field_0xf8,local_198,in_len & 0xfffffffffffffff0);
        }
        else {
          aes128gcmsiv_enc_msg_x8
                    (in,out,&enc_key_expanded.field_0xf8,local_198,in_len & 0xfffffffffffffff0);
        }
      }
      if ((in_len & 0xf) != 0) {
        aead_aes_gcm_siv_asm_crypt_last_block
                  (gcm_siv_ctx_00->is_128_bit,out,in,in_len,&enc_key_expanded.field_0xf8,
                   (aead_aes_gcm_siv_asm_ctx *)local_198);
      }
      ::OPENSSL_memcpy(out_tag,&enc_key_expanded.field_0xf8,0x10);
      *out_tag_len = 0x10;
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(0x1e,0,0x79,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                    ,0x160);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0x1e,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                  ,0x156);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int aead_aes_gcm_siv_asm_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx = asm_ctx_from_ctx(ctx);
  const uint64_t in_len_64 = in_len;
  const uint64_t ad_len_64 = ad_len;

  if (in_len_64 > (UINT64_C(1) << 36) || ad_len_64 >= (UINT64_C(1) << 61)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  if (max_out_tag_len < EVP_AEAD_AES_GCM_SIV_TAG_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (nonce_len != EVP_AEAD_AES_GCM_SIV_NONCE_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  alignas(16) uint64_t record_auth_key[2];
  alignas(16) uint64_t record_enc_key[4];
  aead_aes_gcm_siv_kdf(gcm_siv_ctx->is_128_bit, gcm_siv_ctx, record_auth_key,
                       record_enc_key, nonce);

  alignas(16) uint8_t tag[16] = {0};
  gcm_siv_asm_polyval(tag, in, in_len, ad, ad_len,
                      (const uint8_t *)record_auth_key, nonce);

  struct aead_aes_gcm_siv_asm_ctx enc_key_expanded;

  if (gcm_siv_ctx->is_128_bit) {
    aes128gcmsiv_aes_ks_enc_x1(tag, tag, &enc_key_expanded.key[0],
                               record_enc_key);

    if (in_len < 128) {
      aes128gcmsiv_enc_msg_x4(in, out, tag, &enc_key_expanded, in_len & ~15);
    } else {
      aes128gcmsiv_enc_msg_x8(in, out, tag, &enc_key_expanded, in_len & ~15);
    }
  } else {
    aes256gcmsiv_aes_ks_enc_x1(tag, tag, &enc_key_expanded.key[0],
                               record_enc_key);

    if (in_len < 128) {
      aes256gcmsiv_enc_msg_x4(in, out, tag, &enc_key_expanded, in_len & ~15);
    } else {
      aes256gcmsiv_enc_msg_x8(in, out, tag, &enc_key_expanded, in_len & ~15);
    }
  }

  if (in_len & 15) {
    aead_aes_gcm_siv_asm_crypt_last_block(gcm_siv_ctx->is_128_bit, out, in,
                                          in_len, tag, &enc_key_expanded);
  }

  OPENSSL_memcpy(out_tag, tag, sizeof(tag));
  *out_tag_len = EVP_AEAD_AES_GCM_SIV_TAG_LEN;

  return 1;
}